

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkBinaryRegistry.cpp
# Opt level: O2

void vk::BinaryRegistryDetail::BinaryIndexHashImpl_delete
               (BinaryIndexHashImpl *hash,ProgramBinary *key)

{
  int iVar1;
  long lVar2;
  deUint32 dVar3;
  deBool dVar4;
  BinaryIndexHashImplSlot *pBVar5;
  uint uVar6;
  long lVar7;
  BinaryIndexHashImplSlot **ppBVar8;
  int iVar9;
  BinaryIndexHashImplSlot *pBVar10;
  BinaryIndexHashImplSlot *pBVar11;
  BinaryIndexHashImplSlot *pBVar12;
  
  dVar3 = anon_unknown_8::binaryHash(key);
  uVar6 = hash->slotTableSize - 1U & dVar3;
  pBVar5 = (BinaryIndexHashImplSlot *)0x0;
  pBVar10 = hash->slotTable[(int)uVar6];
  do {
    lVar2 = 0;
    do {
      lVar7 = lVar2;
      iVar1 = pBVar10->numUsed;
      if (iVar1 <= lVar7) {
        pBVar11 = pBVar10->nextSlot;
        pBVar5 = pBVar10;
        goto LAB_008a5132;
      }
      dVar4 = anon_unknown_8::binaryEqual(pBVar10->keys[lVar7],key);
      lVar2 = lVar7 + 1;
      pBVar11 = pBVar10;
    } while (dVar4 == 0);
    do {
      pBVar12 = pBVar5;
      pBVar5 = pBVar11;
      pBVar11 = pBVar5->nextSlot;
    } while (pBVar5->nextSlot != (BinaryIndexHashImplSlot *)0x0);
    iVar9 = pBVar5->numUsed + -1;
    pBVar10->keys[lVar7] = pBVar5->keys[iVar9];
    pBVar10->values[lVar7] = pBVar5->values[iVar9];
    pBVar5->numUsed = pBVar5->numUsed + -1;
    if (pBVar5->numUsed == 0) {
      if (pBVar12 == (BinaryIndexHashImplSlot *)0x0) {
        ppBVar8 = hash->slotTable + (int)uVar6;
      }
      else {
        ppBVar8 = &pBVar12->nextSlot;
      }
      *ppBVar8 = (BinaryIndexHashImplSlot *)0x0;
      pBVar5->nextSlot = hash->slotFreeList;
      hash->slotFreeList = pBVar5;
    }
    hash->numElements = hash->numElements + -1;
    pBVar5 = pBVar12;
    pBVar11 = pBVar10;
LAB_008a5132:
    pBVar10 = pBVar11;
    if (lVar7 < iVar1) {
      return;
    }
  } while( true );
}

Assistant:

BinaryIndexHash::BinaryIndexHash (void)
	: m_hash(BinaryIndexHashImpl_create(m_memPool.getRawPool()))
{
	if (!m_hash)
		throw std::bad_alloc();
}